

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O3

void __thiscall
google::protobuf::strings::UncheckedArrayByteSink::Append
          (UncheckedArrayByteSink *this,char *data,size_t n)

{
  LogMessage *pLVar1;
  char *__dest;
  LogMessage local_68;
  LogFinisher local_29;
  
  __dest = this->dest_;
  if (__dest != data) {
    if (data < __dest + n && __dest <= data) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/bytestream.cc"
                 ,0x3d);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: !(dest_ <= data && data < (dest_ + n)): ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,"Append() data[] overlaps with dest_[]");
      internal::LogFinisher::operator=(&local_29,pLVar1);
      internal::LogMessage::~LogMessage(&local_68);
      __dest = this->dest_;
    }
    memcpy(__dest,data,n);
    __dest = this->dest_;
  }
  this->dest_ = __dest + n;
  return;
}

Assistant:

void UncheckedArrayByteSink::Append(const char* data, size_t n) {
  if (data != dest_) {
    // Catch cases where the pointer returned by GetAppendBuffer() was modified.
    GOOGLE_DCHECK(!(dest_ <= data && data < (dest_ + n)))
        << "Append() data[] overlaps with dest_[]";
    memcpy(dest_, data, n);
  }
  dest_ += n;
}